

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorstream.h
# Opt level: O3

int_type __thiscall
dlib::vectorstream::vector_streambuf::pbackfail(vector_streambuf *this,int_type c)

{
  pointer pcVar1;
  int_type iVar2;
  ulong uVar3;
  
  uVar3 = this->read_pos - 1;
  if (((c == -1) ||
      (pcVar1 = (this->buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start,
      (ulong)((long)(this->buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar1) <= uVar3)) ||
     (iVar2 = -1, (uint)(byte)pcVar1[uVar3] == c)) {
    this->read_pos = uVar3;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int_type pbackfail(
                int_type c
            )
            {  
                // if they are trying to push back a character that they didn't read last
                // that is an error
                const unsigned long prev = read_pos-1;
                if (c != EOF && prev < buffer.size() && 
                    c != static_cast<unsigned char>(buffer[prev]))
                {
                    return EOF;
                }

                read_pos = prev;
                return 1;
            }